

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_draw_buffers_indexed(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_draw_buffers_indexed != 0) {
    glad_glEnableiEXT = (PFNGLENABLEIEXTPROC)(*load)("glEnableiEXT");
    glad_glDisableiEXT = (PFNGLDISABLEIEXTPROC)(*load)("glDisableiEXT");
    glad_glBlendEquationiEXT = (PFNGLBLENDEQUATIONIEXTPROC)(*load)("glBlendEquationiEXT");
    glad_glBlendEquationSeparateiEXT =
         (PFNGLBLENDEQUATIONSEPARATEIEXTPROC)(*load)("glBlendEquationSeparateiEXT");
    glad_glBlendFunciEXT = (PFNGLBLENDFUNCIEXTPROC)(*load)("glBlendFunciEXT");
    glad_glBlendFuncSeparateiEXT =
         (PFNGLBLENDFUNCSEPARATEIEXTPROC)(*load)("glBlendFuncSeparateiEXT");
    glad_glColorMaskiEXT = (PFNGLCOLORMASKIEXTPROC)(*load)("glColorMaskiEXT");
    glad_glIsEnablediEXT = (PFNGLISENABLEDIEXTPROC)(*load)("glIsEnablediEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_draw_buffers_indexed(GLADloadproc load) {
	if(!GLAD_GL_EXT_draw_buffers_indexed) return;
	glad_glEnableiEXT = (PFNGLENABLEIEXTPROC)load("glEnableiEXT");
	glad_glDisableiEXT = (PFNGLDISABLEIEXTPROC)load("glDisableiEXT");
	glad_glBlendEquationiEXT = (PFNGLBLENDEQUATIONIEXTPROC)load("glBlendEquationiEXT");
	glad_glBlendEquationSeparateiEXT = (PFNGLBLENDEQUATIONSEPARATEIEXTPROC)load("glBlendEquationSeparateiEXT");
	glad_glBlendFunciEXT = (PFNGLBLENDFUNCIEXTPROC)load("glBlendFunciEXT");
	glad_glBlendFuncSeparateiEXT = (PFNGLBLENDFUNCSEPARATEIEXTPROC)load("glBlendFuncSeparateiEXT");
	glad_glColorMaskiEXT = (PFNGLCOLORMASKIEXTPROC)load("glColorMaskiEXT");
	glad_glIsEnablediEXT = (PFNGLISENABLEDIEXTPROC)load("glIsEnablediEXT");
}